

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O3

void __thiscall adios2::core::engine::InlineWriter::InitParameters(InlineWriter *this)

{
  IO *pIVar1;
  undefined1 *puVar2;
  char *__nptr;
  int iVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  long lVar9;
  _Rb_tree_header *p_Var10;
  string key;
  string value;
  string local_f8;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  InlineWriter *local_b8;
  string local_b0;
  string local_90;
  char *local_70 [2];
  char local_60 [16];
  string local_50;
  
  pIVar1 = (this->super_Engine).m_IO;
  p_Var7 = (pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(pIVar1->m_Parameters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var10) {
    local_b8 = this;
    do {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      lVar6 = local_d0;
      puVar2 = local_d8;
      if (local_d0 != 0) {
        lVar9 = 0;
        do {
          iVar3 = tolower((int)(char)puVar2[lVar9]);
          puVar2[lVar9] = (char)iVar3;
          lVar9 = lVar9 + 1;
        } while (lVar6 != lVar9);
      }
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,*(long *)(p_Var7 + 2),
                 (long)&(p_Var7[2]._M_parent)->_M_color + *(long *)(p_Var7 + 2));
      iVar3 = std::__cxx11::string::compare((char *)&local_d8);
      __nptr = local_70[0];
      if (iVar3 == 0) {
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        *piVar5 = 0;
        lVar6 = strtol(__nptr,(char **)&local_f8,10);
        if (local_f8._M_dataplus._M_p == __nptr) {
LAB_0049daf8:
          uVar8 = std::__throw_invalid_argument("stoi");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          if (local_d8 != local_c8) {
            operator_delete(local_d8);
          }
          _Unwind_Resume(uVar8);
        }
        uVar4 = (uint)lVar6;
        if (((int)uVar4 != lVar6) || (*piVar5 == 0x22)) {
          std::__throw_out_of_range("stoi");
          goto LAB_0049daf8;
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar3;
        }
        local_b8->m_Verbosity = uVar4;
        if (5 < uVar4) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Engine","");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"InlineWriter","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"InitParameters","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Method verbose argument must be an integer in the range [0,5], in call to Open or Engine constructor"
                     ,"");
          helper::Throw<std::invalid_argument>(&local_f8,&local_90,&local_b0,&local_50,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
        }
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var10);
  }
  return;
}

Assistant:

void InlineWriter::InitParameters()
{
    for (const auto &pair : m_IO.m_Parameters)
    {
        std::string key(pair.first);
        std::transform(key.begin(), key.end(), key.begin(), ::tolower);

        std::string value(pair.second);

        if (key == "verbose")
        {
            m_Verbosity = std::stoi(value);
            if (m_Verbosity < 0 || m_Verbosity > 5)
                helper::Throw<std::invalid_argument>("Engine", "InlineWriter", "InitParameters",
                                                     "Method verbose argument must be an "
                                                     "integer in the range [0,5], in call to "
                                                     "Open or Engine constructor");
        }
    }
}